

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::get_crop
          (CImg<unsigned_int> *__return_storage_ptr__,CImg<unsigned_int> *this,int x0,int y0,int z0,
          int c0,int x1,int y1,int z1,int c1,bool boundary_conditions)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  CImgInstanceException *this_00;
  char *pcVar7;
  char *pcVar8;
  uint *puVar9;
  CImg<unsigned_int> *this_01;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint local_70;
  uint local_6c;
  int x;
  int y;
  int z;
  int c;
  int nc1;
  int nc0;
  int nz1;
  int nz0;
  int ny1;
  int ny0;
  int nx1;
  int nx0;
  bool boundary_conditions_local;
  int c0_local;
  int z0_local;
  int y0_local;
  int x0_local;
  CImg<unsigned_int> *this_local;
  CImg<unsigned_int> *res;
  
  bVar1 = is_empty(this);
  if (bVar1) {
    this_00 = (CImgInstanceException *)__cxa_allocate_exception(0x4008);
    uVar2 = this->_width;
    uVar3 = this->_height;
    uVar4 = this->_depth;
    uVar5 = this->_spectrum;
    puVar9 = this->_data;
    pcVar7 = "non-";
    if ((this->_is_shared & 1U) != 0) {
      pcVar7 = "";
    }
    pcVar8 = pixel_type();
    CImgInstanceException::CImgInstanceException
              (this_00,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::crop(): Empty instance.",
               (ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,puVar9,pcVar7,pcVar8);
    __cxa_throw(this_00,&CImgInstanceException::typeinfo,
                CImgInstanceException::~CImgInstanceException);
  }
  local_bc = x0;
  if (x1 <= x0) {
    local_bc = x1;
  }
  uVar2 = x0 ^ x1 ^ local_bc;
  local_c0 = y0;
  if (y1 <= y0) {
    local_c0 = y1;
  }
  uVar3 = y0 ^ y1 ^ local_c0;
  local_c4 = z0;
  if (z1 <= z0) {
    local_c4 = z1;
  }
  uVar4 = z0 ^ z1 ^ local_c4;
  local_c8 = c0;
  if (c1 <= c0) {
    local_c8 = c1;
  }
  uVar5 = c0 ^ c1 ^ local_c8;
  CImg(__return_storage_ptr__,(uVar2 + 1) - local_bc,(uVar3 + 1) - local_c0,(uVar4 + 1) - local_c4,
       (uVar5 + 1) - local_c8);
  if ((((((int)local_bc < 0) || (iVar6 = width(this), iVar6 <= (int)uVar2)) || ((int)local_c0 < 0))
      || ((iVar6 = height(this), iVar6 <= (int)uVar3 || ((int)local_c4 < 0)))) ||
     ((iVar6 = depth(this), iVar6 <= (int)uVar4 ||
      (((int)local_c8 < 0 || (iVar6 = spectrum(this), iVar6 <= (int)uVar5)))))) {
    if (boundary_conditions) {
      for (y = 0; y < (int)__return_storage_ptr__->_spectrum; y = y + 1) {
        for (x = 0; x < (int)__return_storage_ptr__->_depth; x = x + 1) {
          for (local_6c = 0; (int)local_6c < (int)__return_storage_ptr__->_height;
              local_6c = local_6c + 1) {
            for (local_70 = 0; (int)local_70 < (int)__return_storage_ptr__->_width;
                local_70 = local_70 + 1) {
              uVar2 = _atXYZC(this,local_bc + local_70,local_c0 + local_6c,local_c4 + x,local_c8 + y
                             );
              puVar9 = operator()(__return_storage_ptr__,local_70,local_6c,x,y);
              *puVar9 = uVar2;
            }
          }
        }
      }
    }
    else {
      this_01 = fill(__return_storage_ptr__,0);
      draw_image(this_01,-local_bc,-local_c0,-local_c4,-local_c8,this,1.0);
    }
  }
  else {
    draw_image(__return_storage_ptr__,-local_bc,-local_c0,-local_c4,-local_c8,this,1.0);
  }
  return __return_storage_ptr__;
}

Assistant:

CImg<T> get_crop(const int x0, const int y0, const int z0, const int c0,
                     const int x1, const int y1, const int z1, const int c1,
                     const bool boundary_conditions=false) const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "crop(): Empty instance.",
                                    cimg_instance);
      const int
        nx0 = x0<x1?x0:x1, nx1 = x0^x1^nx0,
        ny0 = y0<y1?y0:y1, ny1 = y0^y1^ny0,
        nz0 = z0<z1?z0:z1, nz1 = z0^z1^nz0,
        nc0 = c0<c1?c0:c1, nc1 = c0^c1^nc0;
      CImg<T> res(1U + nx1 - nx0,1U + ny1 - ny0,1U + nz1 - nz0,1U + nc1 - nc0);
      if (nx0<0 || nx1>=width() || ny0<0 || ny1>=height() || nz0<0 || nz1>=depth() || nc0<0 || nc1>=spectrum()) {
        if (boundary_conditions) cimg_forXYZC(res,x,y,z,c) res(x,y,z,c) = _atXYZC(nx0+x,ny0+y,nz0+z,nc0+c);
        else res.fill(0).draw_image(-nx0,-ny0,-nz0,-nc0,*this);
      } else res.draw_image(-nx0,-ny0,-nz0,-nc0,*this);
      return res;
    }